

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<short,signed_char>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,short *t_lhs,short *c_lhs,char *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  short sVar2;
  undefined8 *puVar3;
  arithmetic_error *paVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar6;
  string local_48;
  
  switch(t_oper) {
  case equals:
    b = *c_lhs == (short)*c_rhs;
    break;
  case less_than:
    b = *c_lhs < (short)*c_rhs;
    break;
  case greater_than:
    b = (short)*c_rhs < *c_lhs;
    break;
  case less_than_equal:
    b = *c_lhs <= (short)*c_rhs;
    break;
  case greater_than_equal:
    b = (short)*c_rhs <= *c_lhs;
    break;
  case not_equal:
    b = *c_lhs != (short)*c_rhs;
    break;
  default:
    if (t_lhs == (short *)0x0) {
switchD_002ef056_caseD_7:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__bad_cast_003ceb38;
      __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
    switch(t_oper) {
    case assign:
      sVar2 = (short)*c_rhs;
      goto LAB_002ef0e4;
    default:
      goto switchD_002ef056_caseD_7;
    case assign_product:
      sVar2 = (short)*c_rhs * *t_lhs;
      goto LAB_002ef0e4;
    case assign_sum:
      *t_lhs = *t_lhs + (short)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<signed_char>(*c_rhs);
      sVar2 = *t_lhs / (short)*c_rhs;
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)(int)*t_lhs % (long)(int)*c_rhs & 0xffffffff);
      goto LAB_002ef0e4;
    case assign_difference:
      *t_lhs = *t_lhs - (short)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<signed_char>(*c_rhs);
      *t_lhs = *t_lhs & (short)*c_rhs;
      _Var5._M_pi = extraout_RDX;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (short)*c_rhs;
      break;
    case assign_shift_left:
      sVar2 = *t_lhs << (*c_rhs & 0x1fU);
      goto LAB_002ef0e4;
    case assign_shift_right:
      sVar2 = (short)((int)*t_lhs >> (*c_rhs & 0x1fU));
LAB_002ef0e4:
      *t_lhs = sVar2;
      break;
    case assign_remainder:
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)(int)*t_lhs % (long)(int)*c_rhs & 0xffffffff);
      *t_lhs = (short)_Var5._M_pi;
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (short)*c_rhs;
    }
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    goto LAB_002ef008;
  case shift_left:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_lhs << (*c_rhs & 0x1fU);
    goto LAB_002eefbf;
  case shift_right:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_lhs >> (*c_rhs & 0x1fU);
    goto LAB_002eefbf;
  case remainder:
    if (*c_rhs == 0) {
      paVar4 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar4,&local_48);
      __cxa_throw(paVar4,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p._0_4_ = (int)*c_lhs % (int)*c_rhs;
    goto LAB_002ef000;
  case bitwise_and:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_rhs & (int)*c_lhs;
    goto LAB_002eeffb;
  case bitwise_or:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_rhs | (int)*c_lhs;
    goto LAB_002eeffb;
  case bitwise_xor:
    local_48._M_dataplus._M_p._0_4_ = (uint)(short)((short)*c_rhs ^ *c_lhs);
    goto LAB_002eefbf;
  case sum:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_rhs + (int)*c_lhs;
    goto LAB_002eeffb;
  case quotient:
    if (*c_rhs == 0) {
      paVar4 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar4,&local_48);
      __cxa_throw(paVar4,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p._0_4_ = (int)*c_lhs / (int)*c_rhs;
    goto LAB_002eefbf;
  case product:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_rhs * (int)*c_lhs;
LAB_002eeffb:
    goto LAB_002ef000;
  case difference:
    local_48._M_dataplus._M_p._0_4_ = (int)*c_lhs - (int)*c_rhs;
LAB_002eefbf:
LAB_002ef000:
    BVar6 = detail::const_var_impl<int>((detail *)this,(int *)&local_48);
    _Var5._M_pi = BVar6.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_002ef008;
  }
  BVar6 = const_var((chaiscript *)this,b);
  _Var5._M_pi = BVar6.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_002ef008:
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }